

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPetNet.cpp
# Opt level: O0

NaPNEvent __thiscall NaPetriNet::step_alive(NaPetriNet *this,bool bDoPrintouts)

{
  FILE *__stream;
  NaPetriNode *pNVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  NaTimer *pNVar7;
  long lVar8;
  NaPetriNode **ppNVar9;
  size_t sVar10;
  undefined4 extraout_var;
  NaPetriConnector *pNVar11;
  undefined4 extraout_var_00;
  char *pcVar12;
  byte in_SIL;
  NaPetriNet *in_RDI;
  NaException exCode_1;
  NaException exCode_3;
  NaPetriNode *node_2;
  NaException exCode_2;
  int iCn_1;
  int iCn;
  NaPetriNode *node_1;
  NaException exCode;
  NaPetriNode *node;
  bool bActivate;
  int iNameLen;
  int iLine;
  int nMaxLen;
  int iActive;
  int nHalted;
  int iNode;
  NaPetriNode **in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  int local_58;
  int local_54;
  byte local_2d;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  byte local_11;
  NaPNEvent local_4;
  
  local_11 = in_SIL & 1;
  local_1c = 0;
  local_20 = 0;
  if ((in_RDI->bStepPrintout & 1U) != 0) {
    local_11 = in_RDI->bStepPrintout & 1;
  }
  if (local_11 != 0) {
    pcVar6 = name(in_RDI);
    NaPrintLog("# net \'%s\', step phases 7, 8, 9.\n",pcVar6);
  }
  if (in_RDI->dfTimeChart != (NaDataFile *)0x0) {
    (*in_RDI->dfTimeChart->_vptr_NaDataFile[6])();
    iVar3 = in_RDI->iPrevIndex;
    pNVar7 = timer(in_RDI);
    iVar2 = (*pNVar7->_vptr_NaTimer[5])();
    if (iVar3 == iVar2) {
      (*in_RDI->dfTimeChart->_vptr_NaDataFile[2])(0,in_RDI->dfTimeChart,0);
    }
    else {
      (*in_RDI->dfTimeChart->_vptr_NaDataFile[2])(0x3fe999999999999a,in_RDI->dfTimeChart,0);
    }
  }
  if (local_11 != 0) {
    NaPrintLog("----------------------------------------\n");
  }
  if ((in_RDI->fpMap != (FILE *)0x0) && (lVar8 = ftell((FILE *)in_RDI->fpMap), lVar8 == 0)) {
    for (local_18 = 0; iVar3 = NaDynAr<NaPetriNode_*>::count(&in_RDI->pnaNet), local_18 < iVar3;
        local_18 = local_18 + 1) {
      fprintf((FILE *)in_RDI->fpMap,"==");
    }
    fputc(10,(FILE *)in_RDI->fpMap);
    local_24 = 0;
    for (local_18 = 0; iVar3 = NaDynAr<NaPetriNode_*>::count(&in_RDI->pnaNet), local_18 < iVar3;
        local_18 = local_18 + 1) {
      ppNVar9 = NaDynAr<NaPetriNode_*>::operator[]
                          ((NaDynAr<NaPetriNode_*> *)
                           CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                           (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
      pcVar6 = NaPetriNode::name(*ppNVar9);
      sVar10 = strlen(pcVar6);
      if ((ulong)(long)local_24 < sVar10) {
        ppNVar9 = NaDynAr<NaPetriNode_*>::operator[]
                            ((NaDynAr<NaPetriNode_*> *)
                             CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                             (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
        pcVar6 = NaPetriNode::name(*ppNVar9);
        sVar10 = strlen(pcVar6);
        local_24 = (int)sVar10;
      }
    }
    for (local_28 = 0; local_28 < local_24; local_28 = local_28 + 1) {
      for (local_18 = 0; iVar3 = NaDynAr<NaPetriNode_*>::count(&in_RDI->pnaNet), local_18 < iVar3;
          local_18 = local_18 + 1) {
        ppNVar9 = NaDynAr<NaPetriNode_*>::operator[]
                            ((NaDynAr<NaPetriNode_*> *)
                             CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                             (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
        pcVar6 = NaPetriNode::name(*ppNVar9);
        sVar10 = strlen(pcVar6);
        if ((int)sVar10 + local_28 < local_24) {
          fprintf((FILE *)in_RDI->fpMap,"  ");
        }
        else {
          __stream = (FILE *)in_RDI->fpMap;
          ppNVar9 = NaDynAr<NaPetriNode_*>::operator[]
                              ((NaDynAr<NaPetriNode_*> *)
                               CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                               (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
          pcVar6 = NaPetriNode::name(*ppNVar9);
          fprintf(__stream," %c",(ulong)(uint)(int)pcVar6[local_28 - (local_24 - (int)sVar10)]);
        }
      }
      fputc(10,(FILE *)in_RDI->fpMap);
    }
    for (local_18 = 0; iVar3 = NaDynAr<NaPetriNode_*>::count(&in_RDI->pnaNet), local_18 < iVar3;
        local_18 = local_18 + 1) {
      fprintf((FILE *)in_RDI->fpMap,"--");
    }
    fputc(10,(FILE *)in_RDI->fpMap);
  }
  local_18 = 0;
  do {
    iVar3 = NaDynAr<NaPetriNode_*>::count(&in_RDI->pnaNet);
    if (iVar3 <= local_18) {
      if (in_RDI->fpMap != (FILE *)0x0) {
        fputc(10,(FILE *)in_RDI->fpMap);
      }
      if (local_20 == 0) {
        local_4 = pneDead;
      }
      else if (local_1c == 0) {
        if ((bUserBreak & 1U) == 0) {
          local_4 = pneAlive;
        }
        else {
          local_4 = pneTerminate;
        }
      }
      else {
        local_4 = pneHalted;
      }
      return local_4;
    }
    local_2d = 0;
    ppNVar9 = NaDynAr<NaPetriNode_*>::operator[]
                        ((NaDynAr<NaPetriNode_*> *)
                         CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                         (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
    pNVar1 = *ppNVar9;
    iVar3 = NaPetriNode::connectors((NaPetriNode *)0x159f0b);
    if (iVar3 == 0) {
      if ((local_11 != 0) || (uVar4 = (*pNVar1->_vptr_NaPetriNode[3])(), (uVar4 & 1) != 0)) {
        pcVar6 = NaPetriNode::name(pNVar1);
        NaPrintLog("node \'%s\' does not have connectors: skip it.\n",pcVar6);
      }
    }
    else {
      if ((local_11 != 0) || (uVar4 = (*pNVar1->_vptr_NaPetriNode[3])(), (uVar4 & 1) != 0)) {
        pcVar6 = NaPetriNode::name(pNVar1);
        NaPrintLog("node \'%s\' try to activate.\n",pcVar6);
      }
      uVar4 = (*pNVar1->_vptr_NaPetriNode[0x11])();
      local_2d = (byte)uVar4 & 1;
      pNVar1->nCalls = pNVar1->nCalls + 1;
      if ((local_11 != 0) || (uVar5 = (*pNVar1->_vptr_NaPetriNode[3])(), (uVar5 & 1) != 0)) {
        pcVar6 = NaPetriNode::name(pNVar1);
        pcVar12 = "not ";
        if ((uVar4 & 1) != 0) {
          pcVar12 = "";
        }
        NaPrintLog("node \'%s\' is %sactivated.\n",pcVar6,pcVar12);
      }
    }
    if (in_RDI->fpMap != (FILE *)0x0) {
      if (local_2d == 0) {
        fprintf((FILE *)in_RDI->fpMap,"  ");
      }
      else {
        fprintf((FILE *)in_RDI->fpMap," a");
      }
    }
    if (local_2d != 0) {
      local_20 = local_20 + 1;
      ppNVar9 = NaDynAr<NaPetriNode_*>::operator[]
                          ((NaDynAr<NaPetriNode_*> *)
                           CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                           (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
      pNVar1 = *ppNVar9;
      if ((local_11 != 0) || (uVar4 = (*pNVar1->_vptr_NaPetriNode[3])(), (uVar4 & 1) != 0)) {
        pcVar6 = NaPetriNode::name(pNVar1);
        NaPrintLog("node \'%s\' action.\n",pcVar6);
      }
      uVar4 = (*pNVar1->_vptr_NaPetriNode[3])();
      if ((uVar4 & 1) != 0) {
        pcVar6 = NaPetriNode::name(pNVar1);
        NaPrintLog("node \'%s\', input data:\n",pcVar6);
        for (local_54 = 0; iVar3 = NaPetriNode::connectors((NaPetriNode *)0x15a484),
            local_54 < iVar3; local_54 = local_54 + 1) {
          pNVar11 = NaPetriNode::connector
                              ((NaPetriNode *)
                               CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                               (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
          iVar3 = (*pNVar11->_vptr_NaPetriConnector[2])();
          if (0 < iVar3) {
            pNVar11 = NaPetriNode::connector
                                ((NaPetriNode *)
                                 CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                                 (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
            iVar3 = (*pNVar11->_vptr_NaPetriConnector[7])();
            if (iVar3 == 0) {
              pNVar11 = NaPetriNode::connector
                                  ((NaPetriNode *)
                                   CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                                   (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
              pcVar6 = NaPetriConnector::name(pNVar11);
              NaPrintLog("  #%d \'%s\': ",(ulong)(local_54 + 1),pcVar6);
              pNVar11 = NaPetriNode::connector
                                  ((NaPetriNode *)
                                   CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                                   (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
              iVar3 = (*pNVar11->_vptr_NaPetriConnector[8])();
              (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0xf8))();
            }
          }
        }
      }
      (*pNVar1->_vptr_NaPetriNode[0x12])();
      uVar4 = (*pNVar1->_vptr_NaPetriNode[3])();
      if ((uVar4 & 1) != 0) {
        pcVar6 = NaPetriNode::name(pNVar1);
        NaPrintLog("node \'%s\', output data:\n",pcVar6);
        for (local_58 = 0; iVar3 = NaPetriNode::connectors((NaPetriNode *)0x15a692),
            local_58 < iVar3; local_58 = local_58 + 1) {
          pNVar11 = NaPetriNode::connector
                              ((NaPetriNode *)
                               CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                               (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
          iVar3 = (*pNVar11->_vptr_NaPetriConnector[2])();
          if (0 < iVar3) {
            pNVar11 = NaPetriNode::connector
                                ((NaPetriNode *)
                                 CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                                 (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
            iVar3 = (*pNVar11->_vptr_NaPetriConnector[7])();
            if (iVar3 == 1) {
              pNVar11 = NaPetriNode::connector
                                  ((NaPetriNode *)
                                   CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                                   (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
              pcVar6 = NaPetriConnector::name(pNVar11);
              NaPrintLog("  #%d \'%s\': ",(ulong)(local_58 + 1),pcVar6);
              pNVar11 = NaPetriNode::connector
                                  ((NaPetriNode *)
                                   CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                                   (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
              iVar3 = (*pNVar11->_vptr_NaPetriConnector[8])();
              (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0xf8))();
            }
          }
        }
      }
      pNVar1->nActivations = pNVar1->nActivations + 1;
      ppNVar9 = NaDynAr<NaPetriNode_*>::operator[]
                          ((NaDynAr<NaPetriNode_*> *)
                           CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                           (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
      if (*ppNVar9 == in_RDI->pTimingNode) {
        pNVar7 = timer(in_RDI);
        (*pNVar7->_vptr_NaTimer[3])();
      }
      ppNVar9 = NaDynAr<NaPetriNode_*>::operator[]
                          ((NaDynAr<NaPetriNode_*> *)
                           CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                           (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
      pNVar1 = *ppNVar9;
      if ((local_11 != 0) || (uVar4 = (*pNVar1->_vptr_NaPetriNode[3])(), (uVar4 & 1) != 0)) {
        pcVar6 = NaPetriNode::name(pNVar1);
        NaPrintLog("node \'%s\' post action.\n",pcVar6);
      }
      (*pNVar1->_vptr_NaPetriNode[0x13])();
      ppNVar9 = NaDynAr<NaPetriNode_*>::operator[]
                          ((NaDynAr<NaPetriNode_*> *)
                           CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                           (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
      if (((*ppNVar9)->bHalt & 1U) != 0) {
        local_1c = local_1c + 1;
      }
    }
    iVar3 = (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
    if (local_11 == 0) {
      ppNVar9 = NaDynAr<NaPetriNode_*>::operator[]
                          ((NaDynAr<NaPetriNode_*> *)
                           CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),iVar3);
      uVar4 = (*(*ppNVar9)->_vptr_NaPetriNode[3])();
      iVar3 = (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
      in_stack_fffffffffffffde7 = (undefined1)uVar4;
      if ((uVar4 & 1) != 0) goto LAB_0015a9b6;
    }
    else {
LAB_0015a9b6:
      in_stack_fffffffffffffdd8 =
           NaDynAr<NaPetriNode_*>::operator[]
                     ((NaDynAr<NaPetriNode_*> *)
                      CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),iVar3);
      (*(*in_stack_fffffffffffffdd8)->_vptr_NaPetriNode[7])();
    }
    if (in_RDI->dfTimeChart != (NaDataFile *)0x0) {
      if (local_2d == 0) {
        (*in_RDI->dfTimeChart->_vptr_NaDataFile[2])
                  ((double)-(local_18 + 1),in_RDI->dfTimeChart,(ulong)(local_18 + 1));
      }
      else {
        (*in_RDI->dfTimeChart->_vptr_NaDataFile[2])
                  ((double)-(local_18 + 1) + 0.8,in_RDI->dfTimeChart,(ulong)(local_18 + 1));
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

NaPNEvent
NaPetriNet::step_alive (bool bDoPrintouts)
{
    int     iNode;
    int     nHalted = 0;
    int     iActive = 0;

    if(bStepPrintout)
      bDoPrintouts = bStepPrintout;

    if(bDoPrintouts){
        NaPrintLog("# net '%s', step phases 7, 8, 9.\n", name());
    }

    // Add point to timechart
    if(NULL != dfTimeChart){
        dfTimeChart->AppendRecord();

        // Time track
        if(iPrevIndex == timer().CurrentIndex()){
            dfTimeChart->SetValue(0.0/* old */, 0/* time */);
        }else{
            dfTimeChart->SetValue(0.8/* new */, 0/* time */);
        }
    }

    if(bDoPrintouts)
      NaPrintLog("----------------------------------------\n");

    if(NULL != fpMap){
      if(0 == ftell(fpMap)){

	/* print line */
	for(iNode = 0; iNode < pnaNet.count(); ++iNode){
	  fprintf(fpMap, "==");
	}/* iNode */
	fputc('\n', fpMap);

	/* compute max length among names */
	int	nMaxLen = 0;

	for(iNode = 0; iNode < pnaNet.count(); ++iNode){
	  if(strlen(pnaNet[iNode]->name()) > nMaxLen){
	    nMaxLen = strlen(pnaNet[iNode]->name());
	  }
	}/* iNode */

	int	iLine;

	/* print header */
	for(iLine = 0; iLine < nMaxLen; ++iLine){
	  for(iNode = 0; iNode < pnaNet.count(); ++iNode){
	    int	iNameLen = strlen(pnaNet[iNode]->name());
	    if(iNameLen + iLine >= nMaxLen){
	      fprintf(fpMap, " %c",
		      pnaNet[iNode]->name()[iLine - (nMaxLen - iNameLen)]);
	    }else{
	      fprintf(fpMap, "  ");
	    }
	  }/* iNode */
	  fputc('\n', fpMap);
	}/* iLine */

	/* print line */
	for(iNode = 0; iNode < pnaNet.count(); ++iNode){
	  fprintf(fpMap, "--");
	}/* iNode */
	fputc('\n', fpMap);

      }/* for the first time */
    }/* activation map */

    for(iNode = 0; iNode < pnaNet.count(); ++iNode){
      bool    bActivate = false;

      try{
	NaPetriNode &node = *pnaNet[iNode];

	// 7. Do one step of node activity and return true if succeeded
	if(0 == node.connectors()) {
	    if(bDoPrintouts || node.is_verbose()){
		NaPrintLog("node '%s' does not have connectors: skip it.\n",
			   node.name());
	    }
	}
	else {
	    if(bDoPrintouts || node.is_verbose()){
		NaPrintLog("node '%s' try to activate.\n",
			   node.name());
	    }

	    bActivate = node.activate();

	    // Count calls
	    ++node.nCalls;

	    if(bDoPrintouts || node.is_verbose()){
		NaPrintLog("node '%s' is %sactivated.\n",
			   node.name(), bActivate?"" :"not ");
	    }
	}
      }catch(NaException exCode){
	NaPrintLog("Step of node activity phase (#7): node '%s' fault.\n"
		   "Caused by exception: %s\n",
		   pnaNet[iNode]->name(), NaExceptionMsg(exCode));
	bActivate = false;
      }

      /* activation map */
      if(NULL != fpMap){
	if(bActivate){
	  fprintf(fpMap, " a");
	}else{
	  fprintf(fpMap, "  ");
	}
      }/* activation map */

      if(bActivate){
	++iActive;

	try{
	  NaPetriNode &node = *pnaNet[iNode];

	  // 8. True action of the node (if activate returned true)
	  if(bDoPrintouts || node.is_verbose()){
	    NaPrintLog("node '%s' action.\n", node.name());
	  }

	  // Print contents of linked inputs
	  if(node.is_verbose()){
            int	iCn;

            NaPrintLog("node '%s', input data:\n", node.name());
            for(iCn = 0; iCn < node.connectors(); ++iCn){
	      if(node.connector(iCn)->links() > 0 &&
		 node.connector(iCn)->kind() == pckInput){
		// Only used input connectors
                NaPrintLog("  #%d '%s': ",
			   iCn + 1, node.connector(iCn)->name());
		node.connector(iCn)->data().print_contents();
	      }
            }
	  }

	  node.action();

	  // Print contents of linked outputs
	  if(node.is_verbose()){
            int	iCn;

            NaPrintLog("node '%s', output data:\n", node.name());
            for(iCn = 0; iCn < node.connectors(); ++iCn){
	      if(node.connector(iCn)->links() > 0 &&
		 node.connector(iCn)->kind() == pckOutput){
		// Only used output connectors
                NaPrintLog("  #%d '%s': ",
			   iCn + 1, node.connector(iCn)->name());
		node.connector(iCn)->data().print_contents();
	      }
            }
	  }

	  // Count activations
	  ++node.nActivations;

	  // Node is timing one - let's update timer
	  if(pnaNet[iNode] == pTimingNode)
	      timer().GoNextTime();

	}catch(NaException exCode){
	  NaPrintLog("True action phase (#8): node '%s' fault.\n"
		     "Caused by exception: %s\n",
		     pnaNet[iNode]->name(), NaExceptionMsg(exCode));
	}

	try{
	  NaPetriNode &node = *pnaNet[iNode];

	  // 9. Finish data processing by the node (if activate
	  //    returned true)
	  if(bDoPrintouts || node.is_verbose()){
	    NaPrintLog("node '%s' post action.\n",
		       node.name());
	  }
	  node.post_action();
	}catch(NaException exCode){
	  NaPrintLog("Postaction phase (#9): node '%s' fault.\n"
		     "Caused by exception: %s\n",
		     pnaNet[iNode]->name(), NaExceptionMsg(exCode));
	}

	// Check for internal halt
	if(pnaNet[iNode]->bHalt){
	  ++nHalted;
	}
      }

      try{
	if(bDoPrintouts || pnaNet[iNode]->is_verbose()){
	  pnaNet[iNode]->describe();
	}
      }catch(NaException exCode){
	// Skip...
      }

      // Add node point to time chart
      if(NULL != dfTimeChart){
	if(bActivate){
	  dfTimeChart->SetValue(-(1 + iNode) + 0.8/* active */, 1+iNode);
	}else{
	  dfTimeChart->SetValue(-(1 + iNode)/* passive */, 1+iNode);
	}
      }
    }

    /* activation map */
    if(NULL != fpMap){
      fputc('\n', fpMap);
    }

    //// Add point to timechart
    //if(NULL != dfTimeChart){
    //    dfTimeChart->AppendRecord();
    //
    //    // Time track
    //    dfTimeChart->SetValue(0.0/* old */, 0/* time */);
    //}

    if(0 == iActive){
        return pneDead;
    }else if(0 != nHalted){
        return pneHalted;
    }

#if defined(unix)
    if(bUserBreak)
      return pneTerminate;
#endif /* unix */

    return pneAlive;
}